

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

void __thiscall
unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
decrement_inode_count<unodb::detail::inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *this)

{
  reference pvVar1;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  
  pvVar1 = std::array<unsigned_long,_5UL>::operator[]((array<unsigned_long,_5UL> *)(this + 0x10),3);
  if (*pvVar1 != 0) {
    pvVar1 = std::array<unsigned_long,_5UL>::operator[]
                       ((array<unsigned_long,_5UL> *)(this + 0x10),3);
    *pvVar1 = *pvVar1 - 1;
    db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::decrease_memory_use
              ((db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)this,0x2a0)
    ;
    return;
  }
  __assert_fail("node_counts[as_i<INode::type>] > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                ,0x5e0,
                "void unodb::db<unsigned long, std::span<const std::byte>>::decrement_inode_count() [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::inode_48<unsigned long, std::span<const std::byte>>]"
               );
}

Assistant:

constexpr void db<Key, Value>::decrement_inode_count() noexcept {
  static_assert(inode_defs_type::template is_inode<INode>());
  UNODB_DETAIL_ASSERT(node_counts[as_i<INode::type>] > 0);

  --node_counts[as_i<INode::type>];
  decrease_memory_use(sizeof(INode));
}